

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitIteratedLogical
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,IteratedLogicalExpr e)

{
  Writer *pWVar1;
  Buffer<char> *pBVar2;
  size_t __n;
  size_t sVar3;
  char *pcVar4;
  ptrdiff_t _Num;
  ulong uVar5;
  char *str;
  
  pWVar1 = this->writer_;
  pBVar2 = pWVar1->buffer_;
  sVar3 = pBVar2->size_;
  uVar5 = sVar3 + 3;
  if (pBVar2->capacity_ < uVar5) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
    sVar3 = pBVar2->size_;
  }
  pcVar4 = pBVar2->ptr_;
  pcVar4[sVar3 + 2] = ' ';
  pcVar4 = pcVar4 + sVar3;
  pcVar4[0] = '/';
  pcVar4[1] = '*';
  pBVar2->size_ = uVar5;
  pcVar4 = internal::ExprInfo::INFO
           [*(uint *)e.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_]
           .str;
  __n = strlen(pcVar4);
  pBVar2 = pWVar1->buffer_;
  uVar5 = pBVar2->size_ + __n;
  if (pBVar2->capacity_ < uVar5) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
  }
  if (__n != 0) {
    memmove(pBVar2->ptr_ + pBVar2->size_,pcVar4,__n);
  }
  pBVar2->size_ = uVar5;
  pBVar2 = pWVar1->buffer_;
  sVar3 = pBVar2->size_;
  uVar5 = sVar3 + 4;
  if (pBVar2->capacity_ < uVar5) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar5);
    sVar3 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar3," */ ",4);
  pBVar2->size_ = uVar5;
  pcVar4 = " && ";
  if (*(int *)e.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_ == 0x42
     ) {
    pcVar4 = " || ";
  }
  ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
  WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>>
            ((ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer> *)this,
             (Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.
                             super_ExprBase.impl_ + 8),
             (Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.
                             super_ExprBase.impl_ +
                       (long)*(int *)((long)e.
                                            super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.
                                            super_ExprBase.impl_ + 4) * 8 + 8),pcVar4,
             (*(int *)e.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_
             != 0x42) + 5);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitIteratedLogical(IteratedLogicalExpr e) {
  // There is no way to produce an AMPL forall/exists expression because
  // its indexing is not available any more. So we write a count expression
  // instead with a comment about the original expression.
  writer_ << "/* " << str(e.kind()) << " */ ";
  int prec = prec::LOGICAL_AND + 1;
  const char *op = " && ";
  if (e.kind() == expr::EXISTS) {
    prec = prec::LOGICAL_OR + 1;
    op = " || ";
  }
  WriteArgs(e, op, prec);
}